

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O2

Status __thiscall
flatbuffers::BaseBfbsGenerator::GenerateCode
          (BaseBfbsGenerator *this,uint8_t *buffer,int64_t length,CodeGenOptions *options)

{
  bool bVar1;
  AdvancedFeatures AVar2;
  int iVar3;
  Status SVar4;
  undefined4 extraout_var;
  Schema *this_00;
  Verifier verifier;
  
  VerifierTemplate<false>::VerifierTemplate(&verifier,buffer,length,0x40,1000000,true);
  bVar1 = reflection::VerifySchemaBuffer(&verifier);
  SVar4 = FAILED_VERIFICATION;
  if (bVar1) {
    if (buffer == (uint8_t *)0x0) {
      this_00 = (Schema *)0x0;
    }
    else {
      this_00 = (Schema *)(buffer + *(uint *)buffer);
    }
    this->schema_ = this_00;
    AVar2 = reflection::Schema::advanced_features(this_00);
    iVar3 = (*(this->super_CodeGenerator)._vptr_CodeGenerator[0xe])(this);
    if ((ulong)AVar2 <= CONCAT44(extraout_var,iVar3)) {
      SVar4 = (*(this->super_CodeGenerator)._vptr_CodeGenerator[0xd])(this,this->schema_,options);
      this->schema_ = (Schema *)0x0;
    }
  }
  return SVar4;
}

Assistant:

Status GenerateCode(const uint8_t *buffer, int64_t length,
                      const CodeGenOptions &options) FLATBUFFERS_OVERRIDE {
    flatbuffers::Verifier verifier(buffer, static_cast<size_t>(length));
    if (!reflection::VerifySchemaBuffer(verifier)) {
      return FAILED_VERIFICATION;
    }

    // Store the root schema since there are cases where leaf nodes refer to
    // things in the root schema (e.g., indexing the objects).
    schema_ = reflection::GetSchema(buffer);

    const uint64_t advance_features = schema_->advanced_features();
    if (advance_features > SupportedAdvancedFeatures()) {
      return FAILED_VERIFICATION;
    }

    Status status = GenerateFromSchema(schema_, options);
    schema_ = nullptr;
    return status;
  }